

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void star_EBNF(Grammar *g)

{
  anon_struct_40_4_d8687ec6_for_elems *v;
  anon_struct_40_4_d8687ec6_for_rules *v_00;
  uint uVar1;
  Elem **ppEVar2;
  Rule **ppRVar3;
  Production *p;
  Rule *pRVar4;
  Elem *pEVar5;
  Rule **ppRVar6;
  
  p = new_internal_production(g,g->p);
  p->field_0x3c = p->field_0x3c & 0xe3 | 0xc;
  pRVar4 = new_rule(g,p);
  v = &pRVar4->elems;
  ppEVar2 = (pRVar4->elems).v;
  if (g->right_recursive_BNF == 0) {
    if (ppEVar2 == (Elem **)0x0) {
      pEVar5 = new_elem_nterm(p,pRVar4);
      (pRVar4->elems).v = (pRVar4->elems).e;
      uVar1 = (pRVar4->elems).n;
      (pRVar4->elems).n = uVar1 + 1;
      (pRVar4->elems).e[uVar1] = pEVar5;
    }
    else {
      uVar1 = (pRVar4->elems).n;
      if (ppEVar2 == (pRVar4->elems).e) {
        if (2 < uVar1) goto LAB_00138a0f;
      }
      else if ((uVar1 & 7) == 0) {
LAB_00138a0f:
        pEVar5 = new_elem_nterm(p,pRVar4);
        vec_add_internal(v,pEVar5);
        goto LAB_00138a25;
      }
      pEVar5 = new_elem_nterm(p,pRVar4);
      uVar1 = (pRVar4->elems).n;
      (pRVar4->elems).n = uVar1 + 1;
      (pRVar4->elems).v[uVar1] = pEVar5;
    }
LAB_00138a25:
    ppEVar2 = (pRVar4->elems).v;
    if (ppEVar2 == (Elem **)0x0) {
      pEVar5 = (g->r->elems).v[(g->r->elems).n - 1];
      (pRVar4->elems).v = (pRVar4->elems).e;
      uVar1 = (pRVar4->elems).n;
      (pRVar4->elems).n = uVar1 + 1;
      (pRVar4->elems).e[uVar1] = pEVar5;
    }
    else {
      uVar1 = (pRVar4->elems).n;
      if (ppEVar2 == (pRVar4->elems).e) {
        if (2 < uVar1) goto LAB_00138ab9;
        pEVar5 = (g->r->elems).v[(g->r->elems).n - 1];
      }
      else {
        if ((uVar1 & 7) == 0) {
LAB_00138ab9:
          vec_add_internal(v,(g->r->elems).v[(g->r->elems).n - 1]);
          goto LAB_00138ad5;
        }
        pEVar5 = (g->r->elems).v[(g->r->elems).n - 1];
      }
      v->n = uVar1 + 1;
      ppEVar2[uVar1] = pEVar5;
    }
LAB_00138ad5:
    pEVar5 = new_elem_nterm(p,g->r);
    (g->r->elems).v[(g->r->elems).n - 1] = pEVar5;
    (pRVar4->elems).v[(pRVar4->elems).n - 1]->rule = pRVar4;
  }
  else {
    if (ppEVar2 == (Elem **)0x0) {
      pEVar5 = (g->r->elems).v[(g->r->elems).n - 1];
      (pRVar4->elems).v = (pRVar4->elems).e;
      uVar1 = (pRVar4->elems).n;
      (pRVar4->elems).n = uVar1 + 1;
      (pRVar4->elems).e[uVar1] = pEVar5;
    }
    else {
      uVar1 = (pRVar4->elems).n;
      if (ppEVar2 == (pRVar4->elems).e) {
        if (2 < uVar1) goto LAB_00138933;
        pEVar5 = (g->r->elems).v[(g->r->elems).n - 1];
      }
      else {
        if ((uVar1 & 7) == 0) {
LAB_00138933:
          vec_add_internal(v,(g->r->elems).v[(g->r->elems).n - 1]);
          goto LAB_0013894f;
        }
        pEVar5 = (g->r->elems).v[(g->r->elems).n - 1];
      }
      v->n = uVar1 + 1;
      ppEVar2[uVar1] = pEVar5;
    }
LAB_0013894f:
    pEVar5 = new_elem_nterm(p,g->r);
    (g->r->elems).v[(g->r->elems).n - 1] = pEVar5;
    ppEVar2 = (pRVar4->elems).v;
    uVar1 = (pRVar4->elems).n;
    ppEVar2[uVar1 - 1]->rule = pRVar4;
    if (ppEVar2 == (pRVar4->elems).e) {
      if (2 < uVar1) goto LAB_001389c2;
    }
    else if ((uVar1 & 7) == 0) {
LAB_001389c2:
      pEVar5 = new_elem_nterm(p,pRVar4);
      vec_add_internal(v,pEVar5);
      goto LAB_00138b0c;
    }
    pEVar5 = new_elem_nterm(p,pRVar4);
    uVar1 = (pRVar4->elems).n;
    (pRVar4->elems).n = uVar1 + 1;
    (pRVar4->elems).v[uVar1] = pEVar5;
  }
LAB_00138b0c:
  v_00 = &p->rules;
  ppRVar3 = (p->rules).v;
  ppRVar6 = (p->rules).e;
  if (ppRVar3 == (Rule **)0x0) {
    (p->rules).v = ppRVar6;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar4;
  }
  else {
    uVar1 = v_00->n;
    if (ppRVar3 == ppRVar6) {
      if (2 < uVar1) goto LAB_00138b57;
    }
    else if ((uVar1 & 7) == 0) {
LAB_00138b57:
      vec_add_internal(v_00,pRVar4);
      goto LAB_00138b62;
    }
    v_00->n = uVar1 + 1;
    ppRVar3[uVar1] = pRVar4;
  }
LAB_00138b62:
  ppRVar3 = (p->rules).v;
  if (ppRVar3 == (Rule **)0x0) {
    pRVar4 = new_rule(g,p);
    (p->rules).v = ppRVar6;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar4;
  }
  else {
    uVar1 = (p->rules).n;
    if (ppRVar3 == ppRVar6) {
      if (2 < uVar1) goto LAB_00138bc1;
    }
    else if ((uVar1 & 7) == 0) {
LAB_00138bc1:
      pRVar4 = new_rule(g,p);
      vec_add_internal(v_00,pRVar4);
      return;
    }
    pRVar4 = new_rule(g,p);
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).v[uVar1] = pRVar4;
  }
  return;
}

Assistant:

void star_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_STAR;
  rr = new_rule(g, pp);
  if (!g->right_recursive_BNF) {
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    vec_add(&rr->elems, last_elem(g->r));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    last_elem(rr)->rule = rr;
  } else {
    vec_add(&rr->elems, last_elem(g->r));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    last_elem(rr)->rule = rr;
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
  }
  vec_add(&pp->rules, rr);
  vec_add(&pp->rules, new_rule(g, pp));
}